

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O0

curls_list * save_curl_handle(curls_list *L,list_node *node)

{
  list_node *local_30;
  list_node *n;
  list_node *h;
  list_node *node_local;
  curls_list *L_local;
  
  L_local = L;
  if (node != (list_node *)0x0) {
    node_local = (list_node *)L;
    if (L == (curls_list *)0x0) {
      node_local = (list_node *)malloc(0x30);
      node_local->next = (list_node *)0x0;
      pthread_mutex_init((pthread_mutex_t *)&node_local->curl,(pthread_mutexattr_t *)0x0);
    }
    pthread_mutex_lock((pthread_mutex_t *)&node_local->curl);
    local_30 = node_local->next;
    if (local_30 == (list_node *)0x0) {
      node_local->next = node;
    }
    else {
      for (; local_30->next != (list_node *)0x0; local_30 = local_30->next) {
      }
      node->next = local_30->next;
      local_30->next = node;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&node_local->curl);
    L_local = (curls_list *)node_local;
  }
  return L_local;
}

Assistant:

static struct curls_list*
save_curl_handle(struct curls_list* L, struct list_node* node){
    if(node == NULL){
        return L;
    }
    if(L == NULL){
        L = malloc(sizeof(struct curls_list));
        L->head = NULL;
        pthread_mutex_init(&L->mutex, NULL);
    }
    pthread_mutex_lock(&L->mutex);
    struct list_node *h = L->head;
    if(h == NULL){
        L->head = node;
    }else{
        struct list_node *n=h;
        while(n->next != NULL){
            n=n->next;
        }
        node->next = n->next;
        n->next = node;
    }
    pthread_mutex_unlock(&L->mutex);
    return L;
}